

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_xmlNodeListGetRawString(void)

{
  int iVar1;
  int iVar2;
  xmlChar *val;
  uint local_3c;
  int n_inLine;
  int inLine;
  int n_list;
  xmlNode *list;
  int n_doc;
  xmlDoc *doc;
  xmlChar *ret_val;
  int mem_base;
  int test_ret;
  
  ret_val._4_4_ = 0;
  for (list._4_4_ = 0; (int)list._4_4_ < 1; list._4_4_ = list._4_4_ + 1) {
    for (n_inLine = 0; n_inLine < 1; n_inLine = n_inLine + 1) {
      for (local_3c = 0; (int)local_3c < 4; local_3c = local_3c + 1) {
        iVar1 = xmlMemBlocks();
        iVar2 = gen_int(local_3c,2);
        val = (xmlChar *)xmlNodeListGetRawString(0,0,iVar2);
        desret_xmlChar_ptr(val);
        call_tests = call_tests + 1;
        des_int(local_3c,iVar2,2);
        xmlResetLastError();
        iVar2 = xmlMemBlocks();
        if (iVar1 != iVar2) {
          iVar2 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlNodeListGetRawString",(ulong)(uint)(iVar2 - iVar1));
          ret_val._4_4_ = ret_val._4_4_ + 1;
          printf(" %d",(ulong)list._4_4_);
          printf(" %d",(ulong)(uint)n_inLine);
          printf(" %d",(ulong)local_3c);
          printf("\n");
        }
      }
    }
  }
  function_tests = function_tests + 1;
  return ret_val._4_4_;
}

Assistant:

static int
test_xmlNodeListGetRawString(void) {
    int test_ret = 0;

#if defined(LIBXML_TREE_ENABLED)
    int mem_base;
    xmlChar * ret_val;
    xmlDoc * doc; /* the document */
    int n_doc;
    xmlNode * list; /* a Node list */
    int n_list;
    int inLine; /* should we replace entity contents or show their external form */
    int n_inLine;

    for (n_doc = 0;n_doc < gen_nb_const_xmlDoc_ptr;n_doc++) {
    for (n_list = 0;n_list < gen_nb_const_xmlNode_ptr;n_list++) {
    for (n_inLine = 0;n_inLine < gen_nb_int;n_inLine++) {
        mem_base = xmlMemBlocks();
        doc = gen_const_xmlDoc_ptr(n_doc, 0);
        list = gen_const_xmlNode_ptr(n_list, 1);
        inLine = gen_int(n_inLine, 2);

        ret_val = xmlNodeListGetRawString((const xmlDoc *)doc, (const xmlNode *)list, inLine);
        desret_xmlChar_ptr(ret_val);
        call_tests++;
        des_const_xmlDoc_ptr(n_doc, (const xmlDoc *)doc, 0);
        des_const_xmlNode_ptr(n_list, (const xmlNode *)list, 1);
        des_int(n_inLine, inLine, 2);
        xmlResetLastError();
        if (mem_base != xmlMemBlocks()) {
            printf("Leak of %d blocks found in xmlNodeListGetRawString",
	           xmlMemBlocks() - mem_base);
	    test_ret++;
            printf(" %d", n_doc);
            printf(" %d", n_list);
            printf(" %d", n_inLine);
            printf("\n");
        }
    }
    }
    }
    function_tests++;
#endif

    return(test_ret);
}